

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

void __thiscall
Catch::
Optional<Catch::BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>::
Optional(Optional<Catch::BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
         *this,BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *_value)

{
  pointer pcVar1;
  double dVar2;
  undefined8 uVar3;
  double dVar4;
  long lVar5;
  Estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *pEVar6;
  char *pcVar7;
  byte bVar8;
  
  bVar8 = 0;
  *(char **)this->storage = this->storage + 0x10;
  pcVar1 = (_value->info).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this->storage,pcVar1,pcVar1 + (_value->info).name._M_string_length);
  *(double *)(this->storage + 0x40) = (_value->info).clockCost;
  dVar2 = (_value->info).estimatedDuration;
  uVar3 = *(undefined8 *)&(_value->info).iterations;
  dVar4 = (_value->info).clockResolution;
  *(undefined8 *)(this->storage + 0x30) = *(undefined8 *)&(_value->info).resamples;
  *(double *)(this->storage + 0x38) = dVar4;
  *(double *)(this->storage + 0x20) = dVar2;
  *(undefined8 *)(this->storage + 0x28) = uVar3;
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  ::vector((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
            *)(this->storage + 0x48),&_value->samples);
  pEVar6 = &_value->mean;
  pcVar7 = this->storage + 0x60;
  for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(rep *)pcVar7 = (pEVar6->point).__r;
    pEVar6 = (Estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)
             ((long)pEVar6 + (ulong)bVar8 * -0x10 + 8);
    pcVar7 = pcVar7 + (ulong)bVar8 * -0x10 + 8;
  }
  this->nullableValue =
       (BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)this->storage
  ;
  return;
}

Assistant:

Optional( T const& _value ):
            nullableValue( new ( storage ) T( _value ) ) {}